

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loopfilter_sse2.c
# Opt level: O0

void transpose_pq_14_sse2
               (__m128i *x0,__m128i *x1,__m128i *x2,__m128i *x3,__m128i *q0p0,__m128i *q1p1,
               __m128i *q2p2,__m128i *q3p3,__m128i *q4p4,__m128i *q5p5,__m128i *q6p6,__m128i *q7p7)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined4 uVar3;
  undefined6 uVar4;
  undefined4 uVar5;
  undefined6 uVar6;
  undefined8 *in_RCX;
  undefined8 *in_RDX;
  undefined8 *in_RSI;
  undefined8 *in_RDI;
  undefined4 *in_R8;
  undefined4 *in_R9;
  undefined4 *in_stack_00000030;
  undefined4 uStack_204;
  undefined4 uStack_1d4;
  undefined4 uStack_1c4;
  undefined4 uStack_194;
  undefined1 local_188;
  undefined1 uStack_187;
  undefined1 uStack_186;
  undefined1 uStack_185;
  undefined1 uStack_184;
  undefined1 uStack_183;
  undefined1 uStack_182;
  undefined1 uStack_181;
  undefined1 local_178;
  undefined1 uStack_177;
  undefined1 uStack_176;
  undefined1 uStack_175;
  undefined1 uStack_174;
  undefined1 uStack_173;
  undefined1 uStack_172;
  undefined1 uStack_171;
  undefined1 local_168;
  undefined1 uStack_167;
  undefined1 uStack_166;
  undefined1 uStack_165;
  undefined1 uStack_164;
  undefined1 uStack_163;
  undefined1 uStack_162;
  undefined1 uStack_161;
  undefined1 local_158;
  undefined1 uStack_157;
  undefined1 uStack_156;
  undefined1 uStack_155;
  undefined1 uStack_154;
  undefined1 uStack_153;
  undefined1 uStack_152;
  undefined1 uStack_151;
  undefined1 uStack_140;
  undefined1 uStack_13f;
  undefined1 uStack_13e;
  undefined1 uStack_13d;
  undefined1 uStack_13c;
  undefined1 uStack_13b;
  undefined1 uStack_13a;
  undefined1 uStack_139;
  undefined1 uStack_130;
  undefined1 uStack_12f;
  undefined1 uStack_12e;
  undefined1 uStack_12d;
  undefined1 uStack_12c;
  undefined1 uStack_12b;
  undefined1 uStack_12a;
  undefined1 uStack_129;
  undefined1 uStack_120;
  undefined1 uStack_11f;
  undefined1 uStack_11e;
  undefined1 uStack_11d;
  undefined1 uStack_11c;
  undefined1 uStack_11b;
  undefined1 uStack_11a;
  undefined1 uStack_119;
  undefined1 uStack_110;
  undefined1 uStack_10f;
  undefined1 uStack_10e;
  undefined1 uStack_10d;
  undefined1 uStack_10c;
  undefined1 uStack_10b;
  undefined1 uStack_10a;
  undefined1 uStack_109;
  undefined2 uStack_106;
  undefined2 uStack_104;
  undefined2 uStack_102;
  undefined2 uStack_f6;
  undefined2 uStack_f4;
  undefined2 uStack_f2;
  undefined2 uStack_e6;
  undefined2 uStack_e4;
  undefined2 uStack_e2;
  undefined2 uStack_d6;
  undefined2 uStack_d4;
  undefined2 uStack_d2;
  undefined4 uStack_ac;
  undefined4 uStack_9c;
  __m128i ww3;
  __m128i ww2;
  __m128i w3;
  __m128i w2;
  __m128i ww1;
  __m128i ww0;
  __m128i w1;
  __m128i w0;
  
  uVar1 = *in_RDI;
  uVar2 = *in_RSI;
  local_158 = (undefined1)uVar1;
  uStack_157 = (undefined1)((ulong)uVar1 >> 8);
  uStack_156 = (undefined1)((ulong)uVar1 >> 0x10);
  uStack_155 = (undefined1)((ulong)uVar1 >> 0x18);
  uStack_154 = (undefined1)((ulong)uVar1 >> 0x20);
  uStack_153 = (undefined1)((ulong)uVar1 >> 0x28);
  uStack_152 = (undefined1)((ulong)uVar1 >> 0x30);
  uStack_151 = (undefined1)((ulong)uVar1 >> 0x38);
  local_168 = (undefined1)uVar2;
  uStack_167 = (undefined1)((ulong)uVar2 >> 8);
  uStack_166 = (undefined1)((ulong)uVar2 >> 0x10);
  uStack_165 = (undefined1)((ulong)uVar2 >> 0x18);
  uStack_164 = (undefined1)((ulong)uVar2 >> 0x20);
  uStack_163 = (undefined1)((ulong)uVar2 >> 0x28);
  uStack_162 = (undefined1)((ulong)uVar2 >> 0x30);
  uStack_161 = (undefined1)((ulong)uVar2 >> 0x38);
  uVar1 = *in_RDX;
  uVar2 = *in_RCX;
  local_178 = (undefined1)uVar1;
  uStack_177 = (undefined1)((ulong)uVar1 >> 8);
  uStack_176 = (undefined1)((ulong)uVar1 >> 0x10);
  uStack_175 = (undefined1)((ulong)uVar1 >> 0x18);
  uStack_174 = (undefined1)((ulong)uVar1 >> 0x20);
  uStack_173 = (undefined1)((ulong)uVar1 >> 0x28);
  uStack_172 = (undefined1)((ulong)uVar1 >> 0x30);
  uStack_171 = (undefined1)((ulong)uVar1 >> 0x38);
  local_188 = (undefined1)uVar2;
  uStack_187 = (undefined1)((ulong)uVar2 >> 8);
  uStack_186 = (undefined1)((ulong)uVar2 >> 0x10);
  uStack_185 = (undefined1)((ulong)uVar2 >> 0x18);
  uStack_184 = (undefined1)((ulong)uVar2 >> 0x20);
  uStack_183 = (undefined1)((ulong)uVar2 >> 0x28);
  uStack_182 = (undefined1)((ulong)uVar2 >> 0x30);
  uStack_181 = (undefined1)((ulong)uVar2 >> 0x38);
  uVar1 = in_RDI[1];
  uVar2 = in_RSI[1];
  uStack_110 = (undefined1)uVar1;
  uStack_10f = (undefined1)((ulong)uVar1 >> 8);
  uStack_10e = (undefined1)((ulong)uVar1 >> 0x10);
  uStack_10d = (undefined1)((ulong)uVar1 >> 0x18);
  uStack_10c = (undefined1)((ulong)uVar1 >> 0x20);
  uStack_10b = (undefined1)((ulong)uVar1 >> 0x28);
  uStack_10a = (undefined1)((ulong)uVar1 >> 0x30);
  uStack_109 = (undefined1)((ulong)uVar1 >> 0x38);
  uStack_120 = (undefined1)uVar2;
  uStack_11f = (undefined1)((ulong)uVar2 >> 8);
  uStack_11e = (undefined1)((ulong)uVar2 >> 0x10);
  uStack_11d = (undefined1)((ulong)uVar2 >> 0x18);
  uStack_11c = (undefined1)((ulong)uVar2 >> 0x20);
  uStack_11b = (undefined1)((ulong)uVar2 >> 0x28);
  uStack_11a = (undefined1)((ulong)uVar2 >> 0x30);
  uStack_119 = (undefined1)((ulong)uVar2 >> 0x38);
  uVar1 = in_RDX[1];
  uVar2 = in_RCX[1];
  uStack_130 = (undefined1)uVar1;
  uStack_12f = (undefined1)((ulong)uVar1 >> 8);
  uStack_12e = (undefined1)((ulong)uVar1 >> 0x10);
  uStack_12d = (undefined1)((ulong)uVar1 >> 0x18);
  uStack_12c = (undefined1)((ulong)uVar1 >> 0x20);
  uStack_12b = (undefined1)((ulong)uVar1 >> 0x28);
  uStack_12a = (undefined1)((ulong)uVar1 >> 0x30);
  uStack_129 = (undefined1)((ulong)uVar1 >> 0x38);
  uStack_140 = (undefined1)uVar2;
  uStack_13f = (undefined1)((ulong)uVar2 >> 8);
  uStack_13e = (undefined1)((ulong)uVar2 >> 0x10);
  uStack_13d = (undefined1)((ulong)uVar2 >> 0x18);
  uStack_13c = (undefined1)((ulong)uVar2 >> 0x20);
  uStack_13b = (undefined1)((ulong)uVar2 >> 0x28);
  uStack_13a = (undefined1)((ulong)uVar2 >> 0x30);
  uStack_139 = (undefined1)((ulong)uVar2 >> 0x38);
  uVar5 = CONCAT13(uStack_167,CONCAT12(uStack_157,CONCAT11(local_168,local_158)));
  uVar6 = CONCAT15(uStack_166,CONCAT14(uStack_156,uVar5));
  uVar3 = CONCAT13(uStack_187,CONCAT12(uStack_177,CONCAT11(local_188,local_178)));
  uVar4 = CONCAT15(uStack_186,CONCAT14(uStack_176,uVar3));
  uStack_d6 = (undefined2)((uint)uVar5 >> 0x10);
  uStack_d4 = (undefined2)((uint6)uVar6 >> 0x20);
  uStack_d2 = (undefined2)(CONCAT17(uStack_165,CONCAT16(uStack_155,uVar6)) >> 0x30);
  uStack_e6 = (undefined2)((uint)uVar3 >> 0x10);
  uStack_e4 = (undefined2)((uint6)uVar4 >> 0x20);
  uStack_e2 = (undefined2)(CONCAT17(uStack_185,CONCAT16(uStack_175,uVar4)) >> 0x30);
  uVar5 = CONCAT13(uStack_163,CONCAT12(uStack_153,CONCAT11(uStack_164,uStack_154)));
  uVar6 = CONCAT15(uStack_162,CONCAT14(uStack_152,uVar5));
  uVar3 = CONCAT13(uStack_183,CONCAT12(uStack_173,CONCAT11(uStack_184,uStack_174)));
  uVar4 = CONCAT15(uStack_182,CONCAT14(uStack_172,uVar3));
  w0[0]._2_2_ = (undefined2)((uint)uVar5 >> 0x10);
  w0[0]._4_2_ = (undefined2)((uint6)uVar6 >> 0x20);
  w0[0]._6_2_ = (undefined2)(CONCAT17(uStack_161,CONCAT16(uStack_151,uVar6)) >> 0x30);
  w1[0]._2_2_ = (undefined2)((uint)uVar3 >> 0x10);
  w1[0]._4_2_ = (undefined2)((uint6)uVar4 >> 0x20);
  w1[0]._6_2_ = (undefined2)(CONCAT17(uStack_181,CONCAT16(uStack_171,uVar4)) >> 0x30);
  uVar5 = CONCAT13(uStack_11f,CONCAT12(uStack_10f,CONCAT11(uStack_120,uStack_110)));
  uVar6 = CONCAT15(uStack_11e,CONCAT14(uStack_10e,uVar5));
  uVar3 = CONCAT13(uStack_13f,CONCAT12(uStack_12f,CONCAT11(uStack_140,uStack_130)));
  uVar4 = CONCAT15(uStack_13e,CONCAT14(uStack_12e,uVar3));
  uStack_f6 = (undefined2)((uint)uVar5 >> 0x10);
  uStack_f4 = (undefined2)((uint6)uVar6 >> 0x20);
  uStack_f2 = (undefined2)(CONCAT17(uStack_11d,CONCAT16(uStack_10d,uVar6)) >> 0x30);
  uStack_106 = (undefined2)((uint)uVar3 >> 0x10);
  uStack_104 = (undefined2)((uint6)uVar4 >> 0x20);
  uStack_102 = (undefined2)(CONCAT17(uStack_13d,CONCAT16(uStack_12d,uVar4)) >> 0x30);
  uVar5 = CONCAT13(uStack_11b,CONCAT12(uStack_10b,CONCAT11(uStack_11c,uStack_10c)));
  uVar6 = CONCAT15(uStack_11a,CONCAT14(uStack_10a,uVar5));
  uVar3 = CONCAT13(uStack_13b,CONCAT12(uStack_12b,CONCAT11(uStack_13c,uStack_12c)));
  uVar4 = CONCAT15(uStack_13a,CONCAT14(uStack_12a,uVar3));
  ww0[0]._2_2_ = (undefined2)((uint)uVar5 >> 0x10);
  ww0[0]._4_2_ = (undefined2)((uint6)uVar6 >> 0x20);
  ww0[0]._6_2_ = (undefined2)(CONCAT17(uStack_119,CONCAT16(uStack_109,uVar6)) >> 0x30);
  ww1[0]._2_2_ = (undefined2)((uint)uVar3 >> 0x10);
  ww1[0]._4_2_ = (undefined2)((uint6)uVar4 >> 0x20);
  ww1[0]._6_2_ = (undefined2)(CONCAT17(uStack_139,CONCAT16(uStack_129,uVar4)) >> 0x30);
  uVar3 = CONCAT22(CONCAT11(local_188,local_178),CONCAT11(local_168,local_158));
  uStack_194 = (undefined4)(CONCAT26(uStack_e6,CONCAT24(uStack_d6,uVar3)) >> 0x20);
  *in_stack_00000030 = uVar3;
  in_stack_00000030[1] = 0;
  in_stack_00000030[2] = uStack_194;
  in_stack_00000030[3] = 0;
  w3[0]._4_4_ = (undefined4)
                (CONCAT26(ww1[0]._6_2_,CONCAT24(ww0[0]._6_2_,CONCAT22(ww1[0]._4_2_,ww0[0]._4_2_)))
                >> 0x20);
  *(uint *)*x0 = CONCAT22(uStack_e6,uStack_d6);
  *(uint *)((long)*x0 + 4) = CONCAT22(ww1[0]._4_2_,ww0[0]._4_2_);
  *(uint *)(*x0 + 1) = CONCAT22(uStack_e4,uStack_d4);
  *(undefined4 *)((long)*x0 + 0xc) = w3[0]._4_4_;
  ww2[0]._4_4_ = (undefined4)
                 (CONCAT26(uStack_e2,CONCAT24(uStack_d2,CONCAT22(uStack_e4,uStack_d4))) >> 0x20);
  *(uint *)*x1 = CONCAT22(uStack_e4,uStack_d4);
  *(uint *)((long)*x1 + 4) = CONCAT22(ww1[0]._2_2_,ww0[0]._2_2_);
  *(undefined4 *)(*x1 + 1) = ww2[0]._4_4_;
  *(uint *)((long)*x1 + 0xc) = CONCAT22(ww1[0]._4_2_,ww0[0]._4_2_);
  uVar3 = CONCAT22(CONCAT11(uStack_13c,uStack_12c),CONCAT11(uStack_11c,uStack_10c));
  uStack_1c4 = (undefined4)(CONCAT26(ww1[0]._2_2_,CONCAT24(ww0[0]._2_2_,uVar3)) >> 0x20);
  *(undefined4 *)*x2 = 0;
  *(undefined4 *)((long)*x2 + 4) = uVar3;
  *(undefined4 *)(*x2 + 1) = 0;
  *(undefined4 *)((long)*x2 + 0xc) = uStack_1c4;
  uVar3 = CONCAT22(CONCAT11(uStack_184,uStack_174),CONCAT11(uStack_164,uStack_154));
  uStack_1d4 = (undefined4)(CONCAT26(w1[0]._2_2_,CONCAT24(w0[0]._2_2_,uVar3)) >> 0x20);
  *(undefined4 *)*x3 = uVar3;
  *(undefined4 *)((long)*x3 + 4) = 0;
  *(undefined4 *)(*x3 + 1) = uStack_1d4;
  *(undefined4 *)((long)*x3 + 0xc) = 0;
  uStack_9c = (undefined4)
              (CONCAT26(uStack_102,CONCAT24(uStack_f2,CONCAT22(uStack_104,uStack_f4))) >> 0x20);
  *(uint *)*q0p0 = CONCAT22(w1[0]._2_2_,w0[0]._2_2_);
  *(uint *)((long)*q0p0 + 4) = CONCAT22(uStack_104,uStack_f4);
  *(uint *)(*q0p0 + 1) = CONCAT22(w1[0]._4_2_,w0[0]._4_2_);
  *(undefined4 *)((long)*q0p0 + 0xc) = uStack_9c;
  uStack_ac = (undefined4)
              (CONCAT26(w1[0]._6_2_,CONCAT24(w0[0]._6_2_,CONCAT22(w1[0]._4_2_,w0[0]._4_2_))) >> 0x20
              );
  *in_R9 = CONCAT22(w1[0]._4_2_,w0[0]._4_2_);
  in_R9[1] = CONCAT22(uStack_106,uStack_f6);
  in_R9[2] = uStack_ac;
  in_R9[3] = CONCAT22(uStack_104,uStack_f4);
  uVar3 = CONCAT22(CONCAT11(uStack_140,uStack_130),CONCAT11(uStack_120,uStack_110));
  uStack_204 = (undefined4)(CONCAT26(uStack_106,CONCAT24(uStack_f6,uVar3)) >> 0x20);
  *in_R8 = 0;
  in_R8[1] = uVar3;
  in_R8[2] = 0;
  in_R8[3] = uStack_204;
  return;
}

Assistant:

static inline void transpose_pq_14_sse2(__m128i *x0, __m128i *x1, __m128i *x2,
                                        __m128i *x3, __m128i *q0p0,
                                        __m128i *q1p1, __m128i *q2p2,
                                        __m128i *q3p3, __m128i *q4p4,
                                        __m128i *q5p5, __m128i *q6p6,
                                        __m128i *q7p7) {
  __m128i w0, w1, ww0, ww1, w2, w3, ww2, ww3;
  w0 = _mm_unpacklo_epi8(
      *x0, *x1);  // 00 10 01 11 02 12 03 13 04 14 05 15 06 16 07 17
  w1 = _mm_unpacklo_epi8(
      *x2, *x3);  // 20 30 21 31 22 32 23 33 24 34 25 35 26 36 27 37
  w2 = _mm_unpackhi_epi8(
      *x0, *x1);  // 08 18 09 19 010 110 011 111 012 112 013 113 014 114 015 115
  w3 = _mm_unpackhi_epi8(
      *x2, *x3);  // 28 38 29 39 210 310 211 311 212 312 213 313 214 314 215 315

  ww0 = _mm_unpacklo_epi16(
      w0, w1);  // 00 10 20 30 01 11 21 31        02 12 22 32 03 13 23 33
  ww1 = _mm_unpackhi_epi16(
      w0, w1);  // 04 14 24 34 05 15 25 35        06 16 26 36 07 17 27 37
  ww2 = _mm_unpacklo_epi16(
      w2, w3);  // 08 18 28 38 09 19 29 39       010 110 210 310 011 111 211 311
  ww3 = _mm_unpackhi_epi16(
      w2,
      w3);  // 012 112 212 312 013 113 213 313  014 114 214 314 015 115 215 315

  *q7p7 = _mm_unpacklo_epi32(
      ww0,
      _mm_srli_si128(
          ww3, 12));  // 00 10 20 30  015 115 215 315  xx xx xx xx xx xx xx xx
  *q6p6 = _mm_unpackhi_epi32(
      _mm_slli_si128(ww0, 4),
      ww3);  // 01 11 21 31  014 114 214 314  xx xx xx xxxx xx xx xx
  *q5p5 = _mm_unpackhi_epi32(
      ww0,
      _mm_slli_si128(
          ww3, 4));  // 02 12 22 32  013 113 213 313  xx xx xx x xx xx xx xxx
  *q4p4 = _mm_unpacklo_epi32(
      _mm_srli_si128(ww0, 12),
      ww3);  // 03 13 23 33  012 112 212 312 xx xx xx xx xx xx xx xx
  *q3p3 = _mm_unpacklo_epi32(
      ww1,
      _mm_srli_si128(
          ww2, 12));  // 04 14 24 34  011 111 211 311 xx xx xx xx xx xx xx xx
  *q2p2 = _mm_unpackhi_epi32(
      _mm_slli_si128(ww1, 4),
      ww2);  // 05 15 25 35   010 110 210 310 xx xx xx xx xx xx xx xx
  *q1p1 = _mm_unpackhi_epi32(
      ww1,
      _mm_slli_si128(
          ww2, 4));  // 06 16 26 36   09 19 29 39     xx xx xx xx xx xx xx xx
  *q0p0 = _mm_unpacklo_epi32(
      _mm_srli_si128(ww1, 12),
      ww2);  // 07 17 27 37  08 18 28 38     xx xx xx xx xx xx xx xx
}